

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

double __thiscall
CBlockPolicyEstimator::estimateCombinedFee
          (CBlockPolicyEstimator *this,uint confTarget,double successThreshold,
          bool checkShorterHorizon,EstimationResult *result)

{
  TxConfirmStats *pTVar1;
  long lVar2;
  uint uVar3;
  EstimationResult *pEVar4;
  TxConfirmStats *this_00;
  EstimationResult *pEVar5;
  long in_FS_OFFSET;
  byte bVar6;
  double dVar7;
  double dVar8;
  EstimationResult local_98;
  long local_28;
  
  bVar6 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  dVar7 = -1.0;
  if ((confTarget != 0) &&
     (pTVar1 = (this->longStats)._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,
     confTarget <=
     (int)((ulong)((long)*(pointer *)
                          ((long)&(pTVar1->confAvg).
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          + 8) -
                  *(long *)&(pTVar1->confAvg).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl) >> 3) * pTVar1->scale * -0x55555555)) {
    this_00 = (this->shortStats)._M_t.
              super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
              super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
              super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    if ((int)((ulong)((long)*(pointer *)
                             ((long)&(this_00->confAvg).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             + 8) -
                     *(long *)&(this_00->confAvg).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data) >> 3) * this_00->scale *
        -0x55555555 < confTarget) {
      this_00 = (this->feeStats)._M_t.
                super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
                super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
                super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
      uVar3 = this->nBestSeenHeight;
      dVar7 = 0.1;
      if ((int)((ulong)((long)*(pointer *)
                               ((long)&(this_00->confAvg).
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               + 8) -
                       *(long *)&(this_00->confAvg).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data) >> 3) * this_00->scale *
          -0x55555555 < confTarget) {
        this_00 = pTVar1;
      }
    }
    else {
      uVar3 = this->nBestSeenHeight;
      dVar7 = 0.5;
    }
    dVar7 = TxConfirmStats::EstimateMedianVal
                      (this_00,confTarget,dVar7,successThreshold,uVar3,result);
    if (checkShorterHorizon) {
      local_98.pass.start = -1.0;
      local_98.pass.end = -1.0;
      local_98.pass.withinTarget = 0.0;
      local_98.pass.totalConfirmed = 0.0;
      local_98.pass.inMempool = 0.0;
      local_98.pass.leftMempool = 0.0;
      local_98.fail.start = -1.0;
      local_98.fail.end = -1.0;
      local_98.fail.withinTarget = 0.0;
      local_98.fail.totalConfirmed = 0.0;
      local_98.fail.inMempool = 0.0;
      local_98.fail.leftMempool._0_4_ = 0;
      local_98.fail.leftMempool._4_4_ = 0;
      local_98.decay._0_4_ = 0;
      local_98._100_8_ = 0;
      pTVar1 = (this->feeStats)._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
      uVar3 = (int)((ulong)((long)*(pointer *)
                                   ((long)&(pTVar1->confAvg).
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   + 8) -
                           (long)(pTVar1->confAvg).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * pTVar1->scale *
              -0x55555555;
      if ((((uVar3 < confTarget) &&
           (dVar8 = TxConfirmStats::EstimateMedianVal
                              (pTVar1,uVar3,0.1,successThreshold,this->nBestSeenHeight,&local_98),
           0.0 < dVar8)) && (((dVar7 == -1.0 && (!NAN(dVar7))) || (dVar8 < dVar7)))) &&
         (dVar7 = dVar8, result != (EstimationResult *)0x0)) {
        pEVar4 = &local_98;
        pEVar5 = result;
        for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
          (pEVar5->pass).start = (pEVar4->pass).start;
          pEVar4 = (EstimationResult *)((long)pEVar4 + ((ulong)bVar6 * -2 + 1) * 8);
          pEVar5 = (EstimationResult *)((long)pEVar5 + (ulong)bVar6 * -0x10 + 8);
        }
        result->scale = local_98.scale;
      }
      pTVar1 = (this->shortStats)._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
      uVar3 = (int)((ulong)((long)*(pointer *)
                                   ((long)&(pTVar1->confAvg).
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   + 8) -
                           (long)(pTVar1->confAvg).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * pTVar1->scale *
              -0x55555555;
      if ((((uVar3 < confTarget) &&
           (dVar8 = TxConfirmStats::EstimateMedianVal
                              (pTVar1,uVar3,0.5,successThreshold,this->nBestSeenHeight,&local_98),
           0.0 < dVar8)) && (((dVar7 == -1.0 && (!NAN(dVar7))) || (dVar8 < dVar7)))) &&
         (dVar7 = dVar8, result != (EstimationResult *)0x0)) {
        pEVar4 = &local_98;
        pEVar5 = result;
        for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
          (pEVar5->pass).start = (pEVar4->pass).start;
          pEVar4 = (EstimationResult *)((long)pEVar4 + ((ulong)bVar6 * -2 + 1) * 8);
          pEVar5 = (EstimationResult *)((long)pEVar5 + (ulong)bVar6 * -0x10 + 8);
        }
        result->scale = local_98.scale;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return dVar7;
}

Assistant:

double CBlockPolicyEstimator::estimateCombinedFee(unsigned int confTarget, double successThreshold, bool checkShorterHorizon, EstimationResult *result) const
{
    double estimate = -1;
    if (confTarget >= 1 && confTarget <= longStats->GetMaxConfirms()) {
        // Find estimate from shortest time horizon possible
        if (confTarget <= shortStats->GetMaxConfirms()) { // short horizon
            estimate = shortStats->EstimateMedianVal(confTarget, SUFFICIENT_TXS_SHORT, successThreshold, nBestSeenHeight, result);
        }
        else if (confTarget <= feeStats->GetMaxConfirms()) { // medium horizon
            estimate = feeStats->EstimateMedianVal(confTarget, SUFFICIENT_FEETXS, successThreshold, nBestSeenHeight, result);
        }
        else { // long horizon
            estimate = longStats->EstimateMedianVal(confTarget, SUFFICIENT_FEETXS, successThreshold, nBestSeenHeight, result);
        }
        if (checkShorterHorizon) {
            EstimationResult tempResult;
            // If a lower confTarget from a more recent horizon returns a lower answer use it.
            if (confTarget > feeStats->GetMaxConfirms()) {
                double medMax = feeStats->EstimateMedianVal(feeStats->GetMaxConfirms(), SUFFICIENT_FEETXS, successThreshold, nBestSeenHeight, &tempResult);
                if (medMax > 0 && (estimate == -1 || medMax < estimate)) {
                    estimate = medMax;
                    if (result) *result = tempResult;
                }
            }
            if (confTarget > shortStats->GetMaxConfirms()) {
                double shortMax = shortStats->EstimateMedianVal(shortStats->GetMaxConfirms(), SUFFICIENT_TXS_SHORT, successThreshold, nBestSeenHeight, &tempResult);
                if (shortMax > 0 && (estimate == -1 || shortMax < estimate)) {
                    estimate = shortMax;
                    if (result) *result = tempResult;
                }
            }
        }
    }
    return estimate;
}